

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O2

int Gia_ManCountConst0PosGia(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int i;
  int iVar3;
  
  i = 0;
  iVar3 = 0;
  while( true ) {
    if (p->vCos->nSize - p->nRegs <= i) {
      return iVar3;
    }
    uVar2 = Vec_IntEntry(p->vCos,i);
    if (((int)uVar2 < 0) || (p->nObjs <= (int)uVar2)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      return iVar3;
    }
    uVar1 = *(uint *)(p->pObjs + uVar2);
    uVar2 = uVar2 - (uVar1 & 0x1fffffff);
    if ((int)uVar2 < 0) break;
    iVar3 = iVar3 + (uint)((uVar2 & 0x7fffffff) == 0 && (uVar1 >> 0x1d & 1) == 0);
    i = i + 1;
  }
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Gia_ManCountConst0PosGia( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachPo( p, pObj, i )
        Counter += (Gia_ObjFaninLit0p(p, pObj) == 0);
    return Counter;
}